

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

uint32_t __thiscall spvtools::opt::Pass::GetPointeeTypeId(Pass *this,Instruction *ptrInst)

{
  uint32_t uVar1;
  DefUseManager *this_00;
  Instruction *this_01;
  
  uVar1 = Instruction::type_id(ptrInst);
  this_00 = get_def_use_mgr(this);
  this_01 = analysis::DefUseManager::GetDef(this_00,uVar1);
  uVar1 = Instruction::GetSingleWordInOperand(this_01,1);
  return uVar1;
}

Assistant:

uint32_t Pass::GetPointeeTypeId(const Instruction* ptrInst) const {
  const uint32_t ptrTypeId = ptrInst->type_id();
  const Instruction* ptrTypeInst = get_def_use_mgr()->GetDef(ptrTypeId);
  return ptrTypeInst->GetSingleWordInOperand(kTypePointerTypeIdInIdx);
}